

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O2

deUint64 vkt::texture::util::anon_unknown_1::readChannel(void *ptr,int byteOffset,int numBytes)

{
  deUint64 dVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  
  uVar2 = (ulong)(uint)numBytes;
  dVar1 = 0;
  uVar3 = 0;
  if (0 < numBytes) {
    uVar3 = (ulong)(uint)numBytes;
  }
  while( true ) {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    if (bVar4) break;
    uVar2 = (ulong)((int)uVar2 + -1);
    dVar1 = dVar1 << 8 | (ulong)*(byte *)((long)ptr + uVar2 + (long)byteOffset);
  }
  return dVar1;
}

Assistant:

deUint64 readChannel (const void* ptr,
					  const int byteOffset,
					  const int numBytes)
{
	const deUint8*	cPtr   = (const deUint8*) ptr + byteOffset;
	deUint64		result = 0;

	for (int byteNdx = 0; byteNdx < numBytes; ++byteNdx)
	{
		result = (result << 8U) | (deUint64) (cPtr[numBytes - byteNdx - 1]);
	}

	return result;
}